

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcomapi.c
# Opt level: O2

void jpeg_destroy(j_common_ptr cinfo)

{
  if (cinfo->mem != (jpeg_memory_mgr *)0x0) {
    (*cinfo->mem->self_destruct)(cinfo);
  }
  cinfo->mem = (jpeg_memory_mgr *)0x0;
  cinfo->global_state = 0;
  return;
}

Assistant:

GLOBAL(void)
jpeg_destroy(j_common_ptr cinfo)
{
  /* We need only tell the memory manager to release everything. */
  /* NB: mem pointer is NULL if memory mgr failed to initialize. */
  if (cinfo->mem != NULL)
    (*cinfo->mem->self_destruct) (cinfo);
  cinfo->mem = NULL;            /* be safe if jpeg_destroy is called twice */
  cinfo->global_state = 0;      /* mark it destroyed */
}